

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequence.cpp
# Opt level: O0

QString * __thiscall QKeySequence::toString(QKeySequence *this,SequenceFormat format)

{
  long lVar1;
  QLatin1StringView s;
  int iVar2;
  undefined8 in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int i;
  int end;
  QString *finalString;
  QKeyCombination in_stack_000000bc;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QString *str;
  undefined4 uVar4;
  SequenceFormat format_00;
  int local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (undefined4)in_RSI;
  format_00 = (SequenceFormat)((ulong)in_RSI >> 0x20);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  str = in_RDI;
  QString::QString((QString *)0x98cd85);
  iVar2 = count((QKeySequence *)in_RDI);
  for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
    QKeyCombination::fromCombined(in_stack_ffffffffffffff88);
    QKeySequencePrivate::encodeString(in_stack_000000bc,format_00);
    QString::operator+=(in_RDI,(QString *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QString::~QString((QString *)0x98cdee);
    QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
    s.m_size._4_4_ = format_00;
    s.m_size._0_4_ = uVar4;
    s.m_data = (char *)QVar3.m_size;
    QString::operator+=((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),s);
  }
  QString::size(in_RDI);
  QString::truncate((longlong)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return str;
}

Assistant:

QString QKeySequence::toString(SequenceFormat format) const
{
    QString finalString;
    // A standard string, with no translation or anything like that. In some ways it will
    // look like our latin case on Windows and X11
    int end = count();
    for (int i = 0; i < end; ++i) {
        finalString += d->encodeString(QKeyCombination::fromCombined(d->key[i]), format);
        finalString += ", "_L1;
    }
    finalString.truncate(finalString.size() - 2);
    return finalString;
}